

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

void google::protobuf::internal::ReflectionOps::Clear(Message *message)

{
  size_type sVar1;
  UnknownFieldSet *this;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_RDI;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *unaff_retaddr;
  Message *in_stack_00000008;
  Reflection *in_stack_00000010;
  Message *in_stack_00000018;
  Reflection *in_stack_00000020;
  int i;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *reflection;
  Message *in_stack_ffffffffffffff98;
  Reflection *in_stack_ffffffffffffffa0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_stack_ffffffffffffffb0;
  int local_38;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_28;
  Reflection *local_10;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_8;
  
  local_8 = in_RDI;
  local_10 = GetReflectionOrDie((Message *)
                                fields.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)0x44ce67);
  Reflection::ListFields(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  local_38 = 0;
  while( true ) {
    sVar1 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(&local_28);
    if (sVar1 <= (ulong)(long)local_38) break;
    in_stack_ffffffffffffffb0 = local_8;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::operator[](&local_28,(long)local_38);
    Reflection::ClearField(in_stack_00000020,in_stack_00000018,(FieldDescriptor *)in_stack_00000010)
    ;
    local_38 = local_38 + 1;
  }
  this = Reflection::MutableUnknownFields(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  UnknownFieldSet::Clear(this);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void ReflectionOps::Clear(Message* message) {
  const Reflection* reflection = GetReflectionOrDie(*message);

  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    reflection->ClearField(message, fields[i]);
  }

  reflection->MutableUnknownFields(message)->Clear();
}